

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

void __thiscall cmCTestRunTest::CheckOutput(cmCTestRunTest *this,string *line)

{
  string *psVar1;
  cmCTest *pcVar2;
  cmCTestTestProperties *pcVar3;
  pointer ppVar4;
  bool bVar5;
  ostream *poVar6;
  long lVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  pointer this_00;
  string label;
  char *local_1b8 [4];
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar6 = (ostream *)std::ostream::operator<<((ostringstream *)&cmCTestLog_msg,this->Index);
  poVar6 = std::operator<<(poVar6,": ");
  poVar6 = std::operator<<(poVar6,(string *)line);
  std::endl<char,std::char_traits<char>>(poVar6);
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2b,label._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&label);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  if ((line->_M_string_length != 0) &&
     (lVar7 = std::__cxx11::string::find((char *)line,0x60abc9), lVar7 != -1)) {
    bVar5 = cmsys::RegularExpression::find(&this->TestHandler->CustomCompletionStatusRegex,line);
    if (bVar5) {
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                ((string *)&cmCTestLog_msg,
                 &(this->TestHandler->CustomCompletionStatusRegex).regmatch,1);
      psVar1 = &(this->TestResult).CustomCompletionStatus;
      std::__cxx11::string::operator=((string *)psVar1,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar6 = (ostream *)std::ostream::operator<<((ostringstream *)&cmCTestLog_msg,this->Index);
      poVar6 = std::operator<<(poVar6,": ");
      poVar6 = std::operator<<(poVar6,"Test Details changed to \'");
      poVar6 = std::operator<<(poVar6,(string *)psVar1);
      poVar6 = std::operator<<(poVar6,"\'");
      std::endl<char,std::char_traits<char>>(poVar6);
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x39,label._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&label);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      return;
    }
    bVar5 = cmsys::RegularExpression::find(&this->TestHandler->CustomLabelRegex,line);
    if (bVar5) {
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                (&label,&(this->TestHandler->CustomLabelRegex).regmatch,1);
      pcVar3 = this->TestProperties;
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((pcVar3->Labels).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pcVar3->Labels).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&label);
      if (_Var8._M_current ==
          (pcVar3->Labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pcVar3->Labels,&label);
        std::
        __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  ((pcVar3->Labels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (pcVar3->Labels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar6 = (ostream *)std::ostream::operator<<(&cmCTestLog_msg,this->Index);
        poVar6 = std::operator<<(poVar6,": ");
        poVar6 = std::operator<<(poVar6,"Test Label added: \'");
        poVar6 = std::operator<<(poVar6,(string *)&label);
        poVar6 = std::operator<<(poVar6,"\'");
        std::endl<char,std::char_traits<char>>(poVar6);
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x44,local_1b8[0],false);
        std::__cxx11::string::~string((string *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
      std::__cxx11::string::~string((string *)&label);
      return;
    }
  }
  psVar1 = &this->ProcessOutput;
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  this_00 = (this->TestProperties->TimeoutRegularExpressions).
            super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (this->TestProperties->TimeoutRegularExpressions).
           super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != ppVar4) {
    do {
      if (this_00 == ppVar4) {
        return;
      }
      bVar5 = cmsys::RegularExpression::find(&this_00->first,psVar1);
      this_00 = this_00 + 1;
    } while (!bVar5);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar6 = (ostream *)std::ostream::operator<<((ostringstream *)&cmCTestLog_msg,this->Index);
    poVar6 = std::operator<<(poVar6,": ");
    poVar6 = std::operator<<(poVar6,"Test timeout changed to ");
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x5a,label._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&label);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmProcess::ResetStartTime
              ((this->TestProcess)._M_t.
               super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
               super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
               super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl);
    cmProcess::ChangeTimeout
              ((this->TestProcess)._M_t.
               super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
               super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
               super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl,
               (cmDuration)(this->TestProperties->AlternateTimeout).__r);
    std::
    vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&this->TestProperties->TimeoutRegularExpressions);
  }
  return;
}

Assistant:

void cmCTestRunTest::CheckOutput(std::string const& line)
{
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             this->GetIndex() << ": " << line << std::endl);

  // Check for special CTest XML tags in this line of output.
  // If any are found, this line is excluded from ProcessOutput.
  if (!line.empty() && line.find("<CTest") != std::string::npos) {
    bool ctest_tag_found = false;
    if (this->TestHandler->CustomCompletionStatusRegex.find(line)) {
      ctest_tag_found = true;
      this->TestResult.CustomCompletionStatus =
        this->TestHandler->CustomCompletionStatusRegex.match(1);
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 this->GetIndex() << ": "
                                  << "Test Details changed to '"
                                  << this->TestResult.CustomCompletionStatus
                                  << "'" << std::endl);
    } else if (this->TestHandler->CustomLabelRegex.find(line)) {
      ctest_tag_found = true;
      auto label = this->TestHandler->CustomLabelRegex.match(1);
      auto& labels = this->TestProperties->Labels;
      if (std::find(labels.begin(), labels.end(), label) == labels.end()) {
        labels.push_back(label);
        std::sort(labels.begin(), labels.end());
        cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                   this->GetIndex()
                     << ": "
                     << "Test Label added: '" << label << "'" << std::endl);
      }
    }
    if (ctest_tag_found) {
      return;
    }
  }

  this->ProcessOutput += line;
  this->ProcessOutput += "\n";

  // Check for TIMEOUT_AFTER_MATCH property.
  if (!this->TestProperties->TimeoutRegularExpressions.empty()) {
    for (auto& reg : this->TestProperties->TimeoutRegularExpressions) {
      if (reg.first.find(this->ProcessOutput)) {
        cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                   this->GetIndex()
                     << ": "
                     << "Test timeout changed to "
                     << std::chrono::duration_cast<std::chrono::seconds>(
                          this->TestProperties->AlternateTimeout)
                          .count()
                     << std::endl);
        this->TestProcess->ResetStartTime();
        this->TestProcess->ChangeTimeout(
          this->TestProperties->AlternateTimeout);
        this->TestProperties->TimeoutRegularExpressions.clear();
        break;
      }
    }
  }
}